

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O1

void __thiscall
TypedImageChannel<Imath_3_2::half>::resize
          (TypedImageChannel<Imath_3_2::half> *this,int width,int height)

{
  long lVar1;
  half *phVar2;
  ulong uVar3;
  
  phVar2 = (this->_pixels)._data;
  if (phVar2 != (half *)0x0) {
    operator_delete__(phVar2);
  }
  lVar1 = (long)height * (long)width;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar1) {
    uVar3 = lVar1 * 2;
  }
  (this->_pixels)._sizeX = 0;
  (this->_pixels)._sizeY = 0;
  (this->_pixels)._data = (half *)0x0;
  phVar2 = (half *)operator_new__(uVar3);
  (this->_pixels)._data = phVar2;
  (this->_pixels)._sizeX = (long)height;
  (this->_pixels)._sizeY = (long)width;
  return;
}

Assistant:

void
TypedImageChannel<T>::resize (int width, int height)
{
    _pixels.resizeEraseUnsafe (height, width);
}